

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID ImGui::DockSpaceOverViewport
                  (ImGuiViewport *viewport,ImGuiDockNodeFlags dockspace_flags,
                  ImGuiWindowClass *window_class)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  ImGuiID IVar3;
  ImGuiContext *g;
  char label [32];
  ImVec2 local_60;
  char local_58 [40];
  
  pIVar2 = GImGui;
  if (viewport == (ImGuiViewport *)0x0) {
    viewport = &(*(GImGui->Viewports).Data)->super_ImGuiViewport;
  }
  uVar1 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar1 | 1;
  (pIVar2->NextWindowData).PosVal = (((ImGuiViewportP *)viewport)->super_ImGuiViewport).Pos;
  (pIVar2->NextWindowData).PosPivotVal.x = 0.0;
  (pIVar2->NextWindowData).PosPivotVal.y = 0.0;
  (pIVar2->NextWindowData).PosCond = 1;
  (pIVar2->NextWindowData).PosUndock = true;
  (pIVar2->NextWindowData).Flags = uVar1 | 3;
  (pIVar2->NextWindowData).SizeVal = (((ImGuiViewportP *)viewport)->super_ImGuiViewport).Size;
  (pIVar2->NextWindowData).SizeCond = 1;
  IVar3 = (((ImGuiViewportP *)viewport)->super_ImGuiViewport).ID;
  (pIVar2->NextWindowData).Flags = uVar1 | 0x83;
  (pIVar2->NextWindowData).ViewportId = IVar3;
  ImFormatString(local_58,0x20,"DockSpaceViewport_%08X",
                 (ulong)(((ImGuiViewportP *)viewport)->super_ImGuiViewport).ID);
  PushStyleVar(2,0.0);
  PushStyleVar(3,0.0);
  local_60.x = 0.0;
  local_60.y = 0.0;
  PushStyleVar(1,&local_60);
  Begin(local_58,(bool *)0x0,(dockspace_flags & 8U) << 4 | 0x282027);
  PopStyleVar(3);
  IVar3 = ImGuiWindow::GetID(GImGui->CurrentWindow,"DockSpace",(char *)0x0);
  local_60.x = 0.0;
  local_60.y = 0.0;
  DockSpace(IVar3,&local_60,dockspace_flags,window_class);
  End();
  return IVar3;
}

Assistant:

ImGuiID ImGui::DockSpaceOverViewport(ImGuiViewport* viewport, ImGuiDockNodeFlags dockspace_flags, const ImGuiWindowClass* window_class)
{
    if (viewport == NULL)
        viewport = GetMainViewport();

    SetNextWindowPos(viewport->Pos);
    SetNextWindowSize(viewport->Size);
    SetNextWindowViewport(viewport->ID);

    ImGuiWindowFlags host_window_flags = 0;
    host_window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoDocking;
    host_window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus | ImGuiWindowFlags_NoNavFocus;
    if (dockspace_flags & ImGuiDockNodeFlags_PassthruCentralNode)
        host_window_flags |= ImGuiWindowFlags_NoBackground;

    char label[32];
    ImFormatString(label, IM_ARRAYSIZE(label), "DockSpaceViewport_%08X", viewport->ID);

    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowBorderSize, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0.0f, 0.0f));
    Begin(label, NULL, host_window_flags);
    PopStyleVar(3);

    ImGuiID dockspace_id = GetID("DockSpace");
    DockSpace(dockspace_id, ImVec2(0.0f, 0.0f), dockspace_flags, window_class);
    End();

    return dockspace_id;
}